

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O0

wchar_t prt_race_class_short(wchar_t row,wchar_t col)

{
  _Bool _Var1;
  size_t sVar2;
  char local_218 [8];
  char buf [512];
  wchar_t col_local;
  wchar_t row_local;
  
  buf._508_4_ = col;
  memset(local_218,0,0x200);
  _Var1 = player_is_shapechanged(player);
  if (_Var1) {
    col_local = L'\0';
  }
  else {
    strnfmt(local_218,0x200,"%s %s",player->race->name,player->class->title[(player->lev + -1) / 5])
    ;
    c_put_str('\r',local_218,row,buf._508_4_);
    sVar2 = strlen(local_218);
    col_local = (int)sVar2 + L'\x01';
  }
  return col_local;
}

Assistant:

static int prt_race_class_short(int row, int col)
{
	char buf[512] = "";

	if (player_is_shapechanged(player)) return 0;

	strnfmt(buf, sizeof(buf), "%s %s",
		player->race->name,
		player->class->title[(player->lev - 1) / 5]);

	c_put_str(COLOUR_L_GREEN, buf, row, col);

	return strlen(buf)+1;
}